

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  Builder builder;
  bool bVar1;
  TransformPromiseNodeBase *this_00;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __flags;
  ReaderOptions receiveOptions;
  bool barFailed;
  int callCount;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:126:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  Client client;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  Own<kj::_::PromiseNode> local_330;
  Builder local_320;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  Maybe<capnp::MessageSize> local_1b0;
  TwoPartyVatNetwork network;
  
  kj::setupAsyncIo();
  callCount = 0;
  handleCount = 0;
  runServer(&serverThread,ioContext.provider.ptr,&callCount,&handleCount);
  __flags = 0x40;
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&network,serverThread.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&rpcClient,&network.super_TwoPartyVatNetworkBase);
  getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)&response1,(Side)&rpcClient,
                   TEST_INTERFACE);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            (&client,(Client *)&response1);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response1);
  local_1b0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&request1,&client,&local_1b0);
  *(undefined4 *)request1.super_Builder._builder.data = 0x7b;
  *(byte *)((long)request1.super_Builder._builder.data + 4) =
       *(byte *)((long)request1.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&promise1,(int)&request1,__buf,__n,__flags);
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::bazRequest(&request2,&client,&local_1c8);
  capnproto_test::capnp::test::TestInterface::BazParams::Builder::initS
            (&local_320,&request2.super_Builder);
  builder._builder.capTable = local_320._builder.capTable;
  builder._builder.segment = local_320._builder.segment;
  builder._builder.data = local_320._builder.data;
  builder._builder.pointers = local_320._builder.pointers;
  builder._builder.dataSize = local_320._builder.dataSize;
  builder._builder.pointerCount = local_320._builder.pointerCount;
  builder._builder._38_2_ = local_320._builder._38_2_;
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
          *)&promise2,(int)&request2,__buf_00,__n,__flags);
  barFailed = false;
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest(&request3,&client,&local_1e0);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)&response1,(int)&request3,__buf_01,__n,__flags);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&response1,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:126:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:128:10)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065fc58;
  this_00[1].dependency.disposer = (Disposer *)&barFailed;
  local_330.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,capnp::_::(anonymous_namespace)::TestCase100::run()::$_0,capnp::_::(anonymous_namespace)::TestCase100::run()::$_1>>
        ::instance;
  response2.super_Reader._reader._0_16_ = ZEXT816(0x65fcb0);
  promise3.super_PromiseBase.node.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,capnp::_::(anonymous_namespace)::TestCase100::run()::$_0,capnp::_::(anonymous_namespace)::TestCase100::run()::$_1>>
        ::instance;
  local_330.ptr = (PromiseNode *)0x0;
  promise3.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  kj::Own<kj::_::PromiseNode>::dispose(&local_330);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response2);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)&response1);
  if ((callCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response1.super_Reader._reader.segment._0_4_ = 0;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x84,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response1,&callCount);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response1,&promise1);
  response2.super_Reader._reader._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response1.super_Reader)
  ;
  bVar1 = kj::operator==("foo",(StringPtr *)&response2);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    response2.super_Reader._reader._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response1.super_Reader);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
               (char (*) [4])0x4f93d8,(Reader *)&response2);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             &response2,&promise2);
  kj::Promise<void>::wait(&promise3,ioContext.waitScope);
  if (callCount != 2 && kj::_::Debug::minSeverity < 3) {
    local_330.disposer = (Disposer *)CONCAT44(local_330.disposer._4_4_,2);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_330,&callCount);
  }
  if ((barFailed == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8f,ERROR,"\"failed: expected \" \"barFailed\"",
               (char (*) [27])"failed: expected barFailed");
  }
  kj::Own<capnp::ResponseHook>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook>::dispose(&response1.hook);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise3);
  kj::Own<capnp::RequestHook>::dispose(&request3.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults>::~RemotePromise(&promise2);
  kj::Own<capnp::RequestHook>::dispose(&request2.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise(&promise1);
  kj::Own<capnp::RequestHook>::dispose(&request1.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  RpcSystemBase::~RpcSystemBase(&rpcClient.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&network);
  kj::AsyncIoProvider::PipeThread::~PipeThread(&serverThread);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(TwoPartyNetwork, Basic) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_INTERFACE).castAs<test::TestInterface>();

  // Use the capability.
  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(ioContext.waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(ioContext.waitScope);

  promise3.wait(ioContext.waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}